

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O1

QpVector * __thiscall Basis::Zprod(Basis *this,QpVector *rhs,QpVector *target)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  QpVector *pQVar8;
  long lVar9;
  int iVar10;
  
  if (0 < (this->buffer_Zprod).num_nz) {
    piVar2 = (this->buffer_Zprod).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->buffer_Zprod).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      pdVar3[piVar2[lVar9]] = 0.0;
      piVar2[lVar9] = 0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->buffer_Zprod).num_nz);
  }
  (this->buffer_Zprod).num_nz = 0;
  (this->buffer_Zprod).dim = target->dim;
  iVar10 = rhs->num_nz;
  if (0 < iVar10) {
    piVar2 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (rhs->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar5 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->buffer_Zprod).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->buffer_Zprod).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      iVar10 = piVar2[lVar9];
      iVar1 = piVar5[piVar4[iVar10]];
      piVar6[lVar9] = iVar1;
      pdVar7[iVar1] = pdVar3[iVar10];
      lVar9 = lVar9 + 1;
      iVar10 = rhs->num_nz;
    } while (lVar9 < iVar10);
  }
  (this->buffer_Zprod).num_nz = iVar10;
  pQVar8 = btran(this,&this->buffer_Zprod,target,false,-1);
  return pQVar8;
}

Assistant:

QpVector& Basis::Zprod(const QpVector& rhs, QpVector& target) {
  buffer_Zprod.reset();
  buffer_Zprod.dim = target.dim;
  for (HighsInt i = 0; i < rhs.num_nz; i++) {
    HighsInt nz = rhs.index[i];
    HighsInt nonactive = non_active_constraint_index[nz];
    HighsInt idx = constraintindexinbasisfactor[nonactive];
    buffer_Zprod.index[i] = idx;
    buffer_Zprod.value[idx] = rhs.value[nz];
  }
  buffer_Zprod.num_nz = rhs.num_nz;
  return btran(buffer_Zprod, target);
}